

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PClass::InitializeSpecials(PClass *this,void *addr)

{
  bool bVar1;
  pair<const_PType_*,_unsigned_int> *ppVar2;
  BYTE *local_60;
  pair<const_PType_*,_unsigned_int> tao;
  const_iterator __end1;
  const_iterator __begin1;
  TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_> *__range1;
  void *addr_local;
  PClass *this_local;
  
  if ((this->bRuntimeClass & 1U) != 0) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                    ,0xc5f,"void PClass::InitializeSpecials(void *) const");
    }
    InitializeSpecials(this->ParentClass,addr);
    __end1 = TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
             ::begin(&this->SpecialInits);
    tao._8_8_ = TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                ::end(&this->SpecialInits);
    while (bVar1 = TIterator<const_std::pair<const_PType_*,_unsigned_int>_>::operator!=
                             (&__end1,(TIterator<const_std::pair<const_PType_*,_unsigned_int>_> *)
                                      &tao.second), bVar1) {
      ppVar2 = TIterator<const_std::pair<const_PType_*,_unsigned_int>_>::operator*(&__end1);
      tao.first = *(PType **)&ppVar2->second;
      if (this->Defaults == (BYTE *)0x0) {
        local_60 = (BYTE *)0x0;
      }
      else {
        local_60 = this->Defaults + ((ulong)tao.first & 0xffffffff);
      }
      (*(ppVar2->first->super_PTypeBase).super_DObject._vptr_DObject[0xd])
                (ppVar2->first,(long)addr + ((ulong)tao.first & 0xffffffff),local_60);
      TIterator<const_std::pair<const_PType_*,_unsigned_int>_>::operator++(&__end1);
    }
  }
  return;
}

Assistant:

void PClass::InitializeSpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle initialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->InitializeSpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->InitializeValue((BYTE*)addr + tao.second, Defaults == nullptr? nullptr : Defaults + tao.second);
	}
}